

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

FilePath __thiscall testing::internal::FilePath::RemoveTrailingPathSeparator(FilePath *this)

{
  bool bVar1;
  char *buffer;
  size_t sVar2;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  String *in_RSI;
  FilePath FVar3;
  String local_28;
  FilePath *this_local;
  
  this_local = this;
  bVar1 = IsDirectory((FilePath *)in_RSI);
  if (bVar1) {
    buffer = String::c_str(in_RSI);
    sVar2 = String::length(in_RSI);
    String::String(&local_28,buffer,sVar2 - 1);
    FilePath(this,&local_28);
    String::~String(&local_28);
    sVar2 = extraout_RDX_00;
  }
  else {
    FilePath(this,(FilePath *)in_RSI);
    sVar2 = extraout_RDX;
  }
  FVar3.pathname_.length_ = sVar2;
  FVar3.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar3.pathname_;
}

Assistant:

FilePath FilePath::RemoveTrailingPathSeparator() const {
  return IsDirectory()
      ? FilePath(String(pathname_.c_str(), pathname_.length() - 1))
      : *this;
}